

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::LookupParameters::clear(LookupParameters *this)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->non_zero_grads)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    TensorTools::Zero((this->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uint)*(size_type *)(p_Var1 + 1));
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->non_zero_grads)._M_h);
  return;
}

Assistant:

void LookupParameters::clear() {
  for (auto i : non_zero_grads)
    TensorTools::Zero(grads[i]);
  non_zero_grads.clear();
}